

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O2

void __thiscall sf2cute::SFPreset::AddZone(SFPreset *this,SFPresetZone *zone)

{
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  SFPreset *pSVar2;
  invalid_argument *this_01;
  pointer *__ptr;
  undefined1 local_38 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (zone->parent_preset_ == (SFPreset *)0x0) {
    SFPresetZone::set_parent_preset(zone,this);
    this_00 = this->parent_file_;
    if (((this_00 != (SoundFont *)0x0) &&
        (p_Var1 = (zone->instrument_).
                  super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi, p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) &&
       (p_Var1->_M_use_count != 0)) {
      std::__shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8),
                 &zone->instrument_);
      SoundFont::AddInstrument(this_00,(shared_ptr<sf2cute::SFInstrument> *)(local_38 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
    }
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone>((SFPresetZone *)local_38);
    std::
    vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>
              ((vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
                *)&this->zones_,
               (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               local_38);
    if ((SFPresetZone *)local_38._0_8_ != (SFPresetZone *)0x0) {
      (**(code **)(*(_func_int **)local_38._0_8_ + 8))();
    }
  }
  else {
    pSVar2 = SFPresetZone::parent_preset(zone);
    if (pSVar2 != this) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_01,"Preset zone has already been owned by another preset.");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return;
}

Assistant:

void SFPreset::AddZone(SFPresetZone zone) {
  // Check the parent preset of the zone.
  if (zone.has_parent_preset()) {
    if (&zone.parent_preset() == this) {
      // If the zone is already be owned by this preset, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Preset zone has already been owned by another preset.");
    }
  }

  // Set this preset to the parent instrument of the zone.
  zone.set_parent_preset(*this);

  // If the zone has an orphan instrument, add it to the parent file.
  if (has_parent_file()) {
    if (zone.has_instrument()) {
      parent_file().AddInstrument(zone.instrument());
    }
  }

  // Add the zone to the list.
  zones_.push_back(std::make_unique<SFPresetZone>(std::move(zone)));
}